

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O0

void __thiscall MeCab::scoped_ptr<MeCab::ContextID>::~scoped_ptr(scoped_ptr<MeCab::ContextID> *this)

{
  scoped_ptr<MeCab::ContextID> *in_RDI;
  
  ~scoped_ptr(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~scoped_ptr() { delete ptr_; }